

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  RTCFilterFunctionN p_Var3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  byte bVar21;
  undefined1 auVar22 [32];
  ulong uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  int iVar28;
  AABBNodeMB4D *node1;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  Geometry *pGVar33;
  uint uVar34;
  Scene *pSVar35;
  ulong *puVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  bool bVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_1691;
  long local_1690;
  undefined8 uStack_1688;
  undefined1 local_1680 [16];
  undefined1 local_1670 [16];
  undefined1 local_1660 [16];
  undefined1 local_1650 [16];
  undefined1 local_1640 [16];
  undefined1 local_1630 [16];
  undefined8 local_1620;
  float fStack_1618;
  float fStack_1614;
  undefined1 local_1610 [16];
  undefined1 local_1600 [16];
  long local_15e8;
  long local_15e0;
  ulong local_15d8;
  RTCFilterFunctionNArguments local_15d0;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  undefined1 local_1560 [16];
  float local_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined1 local_1540 [16];
  undefined1 local_1530 [16];
  undefined1 *local_1520;
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined4 local_12c0;
  undefined4 uStack_12bc;
  undefined4 uStack_12b8;
  undefined4 uStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  undefined4 uStack_12a8;
  undefined4 uStack_12a4;
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  puVar36 = local_11f8;
  local_1200 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar74 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(uVar1
                                                  ,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar81 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(uVar1
                                                  ,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar82 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(uVar1
                                                  ,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  local_1420 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1440 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1460 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_13c0 = local_1420 * 0.99999964;
  local_13e0 = local_1440 * 0.99999964;
  local_1400 = local_1460 * 0.99999964;
  local_1420 = local_1420 * 1.0000004;
  local_1440 = local_1440 * 1.0000004;
  local_1460 = local_1460 * 1.0000004;
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_15d8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar38 = uVar37 ^ 0x20;
  uVar40 = local_15d8 ^ 0x20;
  iVar28 = (tray->tnear).field_0.i[k];
  auVar94 = ZEXT3264(CONCAT428(iVar28,CONCAT424(iVar28,CONCAT420(iVar28,CONCAT416(iVar28,CONCAT412(
                                                  iVar28,CONCAT48(iVar28,CONCAT44(iVar28,iVar28)))))
                                               )));
  iVar28 = (tray->tfar).field_0.i[k];
  auVar95 = ZEXT3264(CONCAT428(iVar28,CONCAT424(iVar28,CONCAT420(iVar28,CONCAT416(iVar28,CONCAT412(
                                                  iVar28,CONCAT48(iVar28,CONCAT44(iVar28,iVar28)))))
                                               )));
  iVar28 = 1 << ((uint)k & 0x1f);
  auVar48._4_4_ = iVar28;
  auVar48._0_4_ = iVar28;
  auVar48._8_4_ = iVar28;
  auVar48._12_4_ = iVar28;
  auVar48._16_4_ = iVar28;
  auVar48._20_4_ = iVar28;
  auVar48._24_4_ = iVar28;
  auVar48._28_4_ = iVar28;
  auVar22 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar48 = vpand_avx2(auVar48,auVar22);
  local_1340 = vpcmpeqd_avx2(auVar48,auVar22);
  bVar42 = true;
  fStack_13bc = local_13c0;
  fStack_13b8 = local_13c0;
  fStack_13b4 = local_13c0;
  fStack_13b0 = local_13c0;
  fStack_13ac = local_13c0;
  fStack_13a8 = local_13c0;
  fStack_13a4 = local_13c0;
  fStack_13dc = local_13e0;
  fStack_13d8 = local_13e0;
  fStack_13d4 = local_13e0;
  fStack_13d0 = local_13e0;
  fStack_13cc = local_13e0;
  fStack_13c8 = local_13e0;
  fStack_13c4 = local_13e0;
  fStack_13fc = local_1400;
  fStack_13f8 = local_1400;
  fStack_13f4 = local_1400;
  fStack_13f0 = local_1400;
  fStack_13ec = local_1400;
  fStack_13e8 = local_1400;
  fStack_13e4 = local_1400;
  fStack_141c = local_1420;
  fStack_1418 = local_1420;
  fStack_1414 = local_1420;
  fStack_1410 = local_1420;
  fStack_140c = local_1420;
  fStack_1408 = local_1420;
  fStack_1404 = local_1420;
  fStack_143c = local_1440;
  fStack_1438 = local_1440;
  fStack_1434 = local_1440;
  fStack_1430 = local_1440;
  fStack_142c = local_1440;
  fStack_1428 = local_1440;
  fStack_1424 = local_1440;
  fStack_145c = local_1460;
  fStack_1458 = local_1460;
  fStack_1454 = local_1460;
  fStack_1450 = local_1460;
  fStack_144c = local_1460;
  fStack_1448 = local_1460;
  fStack_1444 = local_1460;
  do {
    uVar39 = puVar36[-1];
    puVar36 = puVar36 + -1;
    while( true ) {
      local_1360 = auVar74._0_32_;
      local_1380 = auVar81._0_32_;
      local_13a0 = auVar82._0_32_;
      if ((uVar39 & 8) != 0) break;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar49._4_4_ = uVar1;
      auVar49._0_4_ = uVar1;
      auVar49._8_4_ = uVar1;
      auVar49._12_4_ = uVar1;
      auVar49._16_4_ = uVar1;
      auVar49._20_4_ = uVar1;
      auVar49._24_4_ = uVar1;
      auVar49._28_4_ = uVar1;
      uVar29 = uVar39 & 0xfffffffffffffff0;
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x100 + uVar37),auVar49,
                                *(undefined1 (*) [32])(uVar29 + 0x40 + uVar37));
      auVar48 = vsubps_avx(ZEXT1632(auVar43),local_1360);
      auVar22._4_4_ = fStack_13bc * auVar48._4_4_;
      auVar22._0_4_ = local_13c0 * auVar48._0_4_;
      auVar22._8_4_ = fStack_13b8 * auVar48._8_4_;
      auVar22._12_4_ = fStack_13b4 * auVar48._12_4_;
      auVar22._16_4_ = fStack_13b0 * auVar48._16_4_;
      auVar22._20_4_ = fStack_13ac * auVar48._20_4_;
      auVar22._24_4_ = fStack_13a8 * auVar48._24_4_;
      auVar22._28_4_ = auVar48._28_4_;
      auVar48 = vmaxps_avx(auVar94._0_32_,auVar22);
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x100 + local_15d8),auVar49,
                                *(undefined1 (*) [32])(uVar29 + 0x40 + local_15d8));
      auVar22 = vsubps_avx(ZEXT1632(auVar43),local_1380);
      auVar20._4_4_ = fStack_13dc * auVar22._4_4_;
      auVar20._0_4_ = local_13e0 * auVar22._0_4_;
      auVar20._8_4_ = fStack_13d8 * auVar22._8_4_;
      auVar20._12_4_ = fStack_13d4 * auVar22._12_4_;
      auVar20._16_4_ = fStack_13d0 * auVar22._16_4_;
      auVar20._20_4_ = fStack_13cc * auVar22._20_4_;
      auVar20._24_4_ = fStack_13c8 * auVar22._24_4_;
      auVar20._28_4_ = auVar22._28_4_;
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x100 + uVar31),auVar49,
                                *(undefined1 (*) [32])(uVar29 + 0x40 + uVar31));
      auVar22 = vsubps_avx(ZEXT1632(auVar43),local_13a0);
      auVar24._4_4_ = fStack_13fc * auVar22._4_4_;
      auVar24._0_4_ = local_1400 * auVar22._0_4_;
      auVar24._8_4_ = fStack_13f8 * auVar22._8_4_;
      auVar24._12_4_ = fStack_13f4 * auVar22._12_4_;
      auVar24._16_4_ = fStack_13f0 * auVar22._16_4_;
      auVar24._20_4_ = fStack_13ec * auVar22._20_4_;
      auVar24._24_4_ = fStack_13e8 * auVar22._24_4_;
      auVar24._28_4_ = auVar22._28_4_;
      auVar22 = vmaxps_avx(auVar20,auVar24);
      auVar48 = vmaxps_avx(auVar48,auVar22);
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x100 + uVar38),auVar49,
                                *(undefined1 (*) [32])(uVar29 + 0x40 + uVar38));
      auVar22 = vsubps_avx(ZEXT1632(auVar43),local_1360);
      auVar25._4_4_ = fStack_141c * auVar22._4_4_;
      auVar25._0_4_ = local_1420 * auVar22._0_4_;
      auVar25._8_4_ = fStack_1418 * auVar22._8_4_;
      auVar25._12_4_ = fStack_1414 * auVar22._12_4_;
      auVar25._16_4_ = fStack_1410 * auVar22._16_4_;
      auVar25._20_4_ = fStack_140c * auVar22._20_4_;
      auVar25._24_4_ = fStack_1408 * auVar22._24_4_;
      auVar25._28_4_ = auVar22._28_4_;
      auVar22 = vminps_avx(auVar95._0_32_,auVar25);
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x100 + uVar40),auVar49,
                                *(undefined1 (*) [32])(uVar29 + 0x40 + uVar40));
      auVar20 = vsubps_avx(ZEXT1632(auVar43),local_1380);
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar29 + 0x100 + (uVar31 ^ 0x20)),auVar49,
                                *(undefined1 (*) [32])(uVar29 + 0x40 + (uVar31 ^ 0x20)));
      auVar26._4_4_ = fStack_143c * auVar20._4_4_;
      auVar26._0_4_ = local_1440 * auVar20._0_4_;
      auVar26._8_4_ = fStack_1438 * auVar20._8_4_;
      auVar26._12_4_ = fStack_1434 * auVar20._12_4_;
      auVar26._16_4_ = fStack_1430 * auVar20._16_4_;
      auVar26._20_4_ = fStack_142c * auVar20._20_4_;
      auVar26._24_4_ = fStack_1428 * auVar20._24_4_;
      auVar26._28_4_ = auVar20._28_4_;
      auVar20 = vsubps_avx(ZEXT1632(auVar43),local_13a0);
      auVar27._4_4_ = fStack_145c * auVar20._4_4_;
      auVar27._0_4_ = local_1460 * auVar20._0_4_;
      auVar27._8_4_ = fStack_1458 * auVar20._8_4_;
      auVar27._12_4_ = fStack_1454 * auVar20._12_4_;
      auVar27._16_4_ = fStack_1450 * auVar20._16_4_;
      auVar27._20_4_ = fStack_144c * auVar20._20_4_;
      auVar27._24_4_ = fStack_1448 * auVar20._24_4_;
      auVar27._28_4_ = auVar20._28_4_;
      auVar20 = vminps_avx(auVar26,auVar27);
      auVar22 = vminps_avx(auVar22,auVar20);
      auVar48 = vcmpps_avx(auVar48,auVar22,2);
      if (((uint)uVar39 & 7) == 6) {
        auVar22 = vcmpps_avx(*(undefined1 (*) [32])(uVar29 + 0x1c0),auVar49,2);
        auVar20 = vcmpps_avx(auVar49,*(undefined1 (*) [32])(uVar29 + 0x1e0),1);
        auVar22 = vandps_avx(auVar22,auVar20);
        auVar48 = vandps_avx(auVar22,auVar48);
        auVar43 = vpackssdw_avx(auVar48._0_16_,auVar48._16_16_);
      }
      else {
        auVar43 = vpackssdw_avx(auVar48._0_16_,auVar48._16_16_);
      }
      auVar43 = vpsllw_avx(auVar43,0xf);
      if ((((((((auVar43 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar43 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar43 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar43 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar43[0xf])
      goto LAB_0062d40f;
      auVar43 = vpacksswb_avx(auVar43,auVar43);
      bVar21 = SUB161(auVar43 >> 7,0) & 1 | (SUB161(auVar43 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar43 >> 0x17,0) & 1) << 2 | (SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar43 >> 0x27,0) & 1) << 4 | (SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar43 >> 0x37,0) & 1) << 6 | SUB161(auVar43 >> 0x3f,0) << 7;
      lVar30 = 0;
      for (uVar39 = (ulong)bVar21; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar39 = *(ulong *)(uVar29 + lVar30 * 8);
      uVar34 = bVar21 - 1 & (uint)bVar21;
      uVar32 = (ulong)uVar34;
      if (uVar34 != 0) {
        *puVar36 = uVar39;
        lVar30 = 0;
        for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
          lVar30 = lVar30 + 1;
        }
        uVar34 = uVar34 - 1 & uVar34;
        uVar32 = (ulong)uVar34;
        bVar41 = uVar34 == 0;
        while( true ) {
          puVar36 = puVar36 + 1;
          uVar39 = *(ulong *)(uVar29 + lVar30 * 8);
          if (bVar41) break;
          *puVar36 = uVar39;
          lVar30 = 0;
          for (uVar39 = uVar32; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
            lVar30 = lVar30 + 1;
          }
          uVar32 = uVar32 - 1 & uVar32;
          bVar41 = uVar32 == 0;
        }
      }
    }
    local_15e0 = (ulong)((uint)uVar39 & 0xf) - 8;
    if (local_15e0 != 0) {
      uVar39 = uVar39 & 0xfffffffffffffff0;
      local_15e8 = 0;
      local_1480 = auVar94._0_32_;
      local_14a0 = auVar95._0_32_;
      do {
        lVar30 = local_15e8 * 0x140;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar63._4_4_ = uVar1;
        auVar63._0_4_ = uVar1;
        auVar63._8_4_ = uVar1;
        auVar63._12_4_ = uVar1;
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x90 + lVar30),auVar63,
                                  *(undefined1 (*) [16])(uVar39 + lVar30));
        auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xa0 + lVar30),auVar63,
                                  *(undefined1 (*) [16])(uVar39 + 0x10 + lVar30));
        auVar56 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xb0 + lVar30),auVar63,
                                  *(undefined1 (*) [16])(uVar39 + 0x20 + lVar30));
        auVar69 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xc0 + lVar30),auVar63,
                                  *(undefined1 (*) [16])(uVar39 + 0x30 + lVar30));
        auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xd0 + lVar30),auVar63,
                                  *(undefined1 (*) [16])(uVar39 + 0x40 + lVar30));
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xe0 + lVar30),auVar63,
                                  *(undefined1 (*) [16])(uVar39 + 0x50 + lVar30));
        auVar65 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xf0 + lVar30),auVar63,
                                  *(undefined1 (*) [16])(uVar39 + 0x60 + lVar30));
        auVar75 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x100 + lVar30),auVar63,
                                  *(undefined1 (*) [16])(uVar39 + 0x70 + lVar30));
        auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x110 + lVar30),auVar63,
                                  *(undefined1 (*) [16])(uVar39 + 0x80 + lVar30));
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar64._4_4_ = uVar1;
        auVar64._0_4_ = uVar1;
        auVar64._8_4_ = uVar1;
        auVar64._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar91._4_4_ = uVar1;
        auVar91._0_4_ = uVar1;
        auVar91._8_4_ = uVar1;
        auVar91._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar93._4_4_ = uVar1;
        auVar93._0_4_ = uVar1;
        auVar93._8_4_ = uVar1;
        auVar93._12_4_ = uVar1;
        local_1600 = vsubps_avx(auVar43,auVar64);
        local_1610 = vsubps_avx(auVar76,auVar91);
        local_1630 = vsubps_avx(auVar56,auVar93);
        auVar43 = vsubps_avx(auVar69,auVar64);
        auVar76 = vsubps_avx(auVar70,auVar91);
        auVar56 = vsubps_avx(auVar51,auVar93);
        auVar69 = vsubps_avx(auVar65,auVar64);
        auVar70 = vsubps_avx(auVar75,auVar91);
        auVar51 = vsubps_avx(auVar44,auVar93);
        local_1640 = vsubps_avx(auVar69,local_1600);
        local_1660 = vsubps_avx(auVar70,local_1610);
        local_1650 = vsubps_avx(auVar51,local_1630);
        auVar44._0_4_ = auVar69._0_4_ + local_1600._0_4_;
        auVar44._4_4_ = auVar69._4_4_ + local_1600._4_4_;
        auVar44._8_4_ = auVar69._8_4_ + local_1600._8_4_;
        auVar44._12_4_ = auVar69._12_4_ + local_1600._12_4_;
        auVar60._0_4_ = auVar70._0_4_ + local_1610._0_4_;
        auVar60._4_4_ = auVar70._4_4_ + local_1610._4_4_;
        auVar60._8_4_ = auVar70._8_4_ + local_1610._8_4_;
        auVar60._12_4_ = auVar70._12_4_ + local_1610._12_4_;
        fVar4 = local_1630._0_4_;
        auVar65._0_4_ = auVar51._0_4_ + fVar4;
        fVar5 = local_1630._4_4_;
        auVar65._4_4_ = auVar51._4_4_ + fVar5;
        fVar6 = local_1630._8_4_;
        auVar65._8_4_ = auVar51._8_4_ + fVar6;
        fVar7 = local_1630._12_4_;
        auVar65._12_4_ = auVar51._12_4_ + fVar7;
        auVar92._0_4_ = local_1650._0_4_ * auVar60._0_4_;
        auVar92._4_4_ = local_1650._4_4_ * auVar60._4_4_;
        auVar92._8_4_ = local_1650._8_4_ * auVar60._8_4_;
        auVar92._12_4_ = local_1650._12_4_ * auVar60._12_4_;
        auVar75 = vfmsub231ps_fma(auVar92,local_1660,auVar65);
        auVar66._0_4_ = auVar65._0_4_ * local_1640._0_4_;
        auVar66._4_4_ = auVar65._4_4_ * local_1640._4_4_;
        auVar66._8_4_ = auVar65._8_4_ * local_1640._8_4_;
        auVar66._12_4_ = auVar65._12_4_ * local_1640._12_4_;
        auVar65 = vfmsub231ps_fma(auVar66,local_1650,auVar44);
        auVar45._0_4_ = local_1660._0_4_ * auVar44._0_4_;
        auVar45._4_4_ = local_1660._4_4_ * auVar44._4_4_;
        auVar45._8_4_ = local_1660._8_4_ * auVar44._8_4_;
        auVar45._12_4_ = local_1660._12_4_ * auVar44._12_4_;
        auVar44 = vfmsub231ps_fma(auVar45,local_1640,auVar60);
        local_1620._4_4_ = *(float *)(ray + k * 4 + 0xc0);
        auVar87._0_4_ = auVar44._0_4_ * local_1620._4_4_;
        auVar87._4_4_ = auVar44._4_4_ * local_1620._4_4_;
        auVar87._8_4_ = auVar44._8_4_ * local_1620._4_4_;
        auVar87._12_4_ = auVar44._12_4_ * local_1620._4_4_;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0xa0);
        auVar90._4_4_ = uVar1;
        auVar90._0_4_ = uVar1;
        auVar90._8_4_ = uVar1;
        auVar90._12_4_ = uVar1;
        auVar65 = vfmadd231ps_fma(auVar87,auVar90,auVar65);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_1680._4_4_ = uVar1;
        local_1680._0_4_ = uVar1;
        local_1680._8_4_ = uVar1;
        local_1680._12_4_ = uVar1;
        local_1570 = vfmadd231ps_fma(auVar65,local_1680,auVar75);
        auVar65 = vsubps_avx(local_1610,auVar76);
        local_1560 = vsubps_avx(local_1630,auVar56);
        auVar61._0_4_ = local_1610._0_4_ + auVar76._0_4_;
        auVar61._4_4_ = local_1610._4_4_ + auVar76._4_4_;
        auVar61._8_4_ = local_1610._8_4_ + auVar76._8_4_;
        auVar61._12_4_ = local_1610._12_4_ + auVar76._12_4_;
        auVar67._0_4_ = fVar4 + auVar56._0_4_;
        auVar67._4_4_ = fVar5 + auVar56._4_4_;
        auVar67._8_4_ = fVar6 + auVar56._8_4_;
        auVar67._12_4_ = fVar7 + auVar56._12_4_;
        fVar8 = local_1560._0_4_;
        auVar75._0_4_ = auVar61._0_4_ * fVar8;
        fVar11 = local_1560._4_4_;
        auVar75._4_4_ = auVar61._4_4_ * fVar11;
        fVar14 = local_1560._8_4_;
        auVar75._8_4_ = auVar61._8_4_ * fVar14;
        fVar17 = local_1560._12_4_;
        auVar75._12_4_ = auVar61._12_4_ * fVar17;
        auVar45 = vfmsub231ps_fma(auVar75,auVar65,auVar67);
        auVar75 = vsubps_avx(local_1600,auVar43);
        fVar9 = auVar75._0_4_;
        auVar68._0_4_ = auVar67._0_4_ * fVar9;
        fVar12 = auVar75._4_4_;
        auVar68._4_4_ = auVar67._4_4_ * fVar12;
        fVar15 = auVar75._8_4_;
        auVar68._8_4_ = auVar67._8_4_ * fVar15;
        fVar18 = auVar75._12_4_;
        auVar68._12_4_ = auVar67._12_4_ * fVar18;
        auVar83._0_4_ = local_1600._0_4_ + auVar43._0_4_;
        auVar83._4_4_ = local_1600._4_4_ + auVar43._4_4_;
        auVar83._8_4_ = local_1600._8_4_ + auVar43._8_4_;
        auVar83._12_4_ = local_1600._12_4_ + auVar43._12_4_;
        auVar44 = vfmsub231ps_fma(auVar68,local_1560,auVar83);
        fVar10 = auVar65._0_4_;
        auVar84._0_4_ = auVar83._0_4_ * fVar10;
        fVar13 = auVar65._4_4_;
        auVar84._4_4_ = auVar83._4_4_ * fVar13;
        fVar16 = auVar65._8_4_;
        auVar84._8_4_ = auVar83._8_4_ * fVar16;
        fVar19 = auVar65._12_4_;
        auVar84._12_4_ = auVar83._12_4_ * fVar19;
        auVar50 = vfmsub231ps_fma(auVar84,auVar75,auVar61);
        auVar62._0_4_ = auVar50._0_4_ * local_1620._4_4_;
        auVar62._4_4_ = auVar50._4_4_ * local_1620._4_4_;
        auVar62._8_4_ = auVar50._8_4_ * local_1620._4_4_;
        auVar62._12_4_ = auVar50._12_4_ * local_1620._4_4_;
        auVar44 = vfmadd231ps_fma(auVar62,auVar90,auVar44);
        local_1540 = vfmadd231ps_fma(auVar44,local_1680,auVar45);
        auVar44 = vsubps_avx(auVar43,auVar69);
        auVar55._0_4_ = auVar43._0_4_ + auVar69._0_4_;
        auVar55._4_4_ = auVar43._4_4_ + auVar69._4_4_;
        auVar55._8_4_ = auVar43._8_4_ + auVar69._8_4_;
        auVar55._12_4_ = auVar43._12_4_ + auVar69._12_4_;
        auVar69 = vsubps_avx(auVar76,auVar70);
        auVar50._0_4_ = auVar76._0_4_ + auVar70._0_4_;
        auVar50._4_4_ = auVar76._4_4_ + auVar70._4_4_;
        auVar50._8_4_ = auVar76._8_4_ + auVar70._8_4_;
        auVar50._12_4_ = auVar76._12_4_ + auVar70._12_4_;
        auVar70 = vsubps_avx(auVar56,auVar51);
        auVar43._0_4_ = auVar56._0_4_ + auVar51._0_4_;
        auVar43._4_4_ = auVar56._4_4_ + auVar51._4_4_;
        auVar43._8_4_ = auVar56._8_4_ + auVar51._8_4_;
        auVar43._12_4_ = auVar56._12_4_ + auVar51._12_4_;
        auVar76._0_4_ = auVar70._0_4_ * auVar50._0_4_;
        auVar76._4_4_ = auVar70._4_4_ * auVar50._4_4_;
        auVar76._8_4_ = auVar70._8_4_ * auVar50._8_4_;
        auVar76._12_4_ = auVar70._12_4_ * auVar50._12_4_;
        auVar76 = vfmsub231ps_fma(auVar76,auVar69,auVar43);
        auVar71._0_4_ = auVar43._0_4_ * auVar44._0_4_;
        auVar71._4_4_ = auVar43._4_4_ * auVar44._4_4_;
        auVar71._8_4_ = auVar43._8_4_ * auVar44._8_4_;
        auVar71._12_4_ = auVar43._12_4_ * auVar44._12_4_;
        auVar43 = vfmsub231ps_fma(auVar71,auVar70,auVar55);
        auVar56._0_4_ = auVar69._0_4_ * auVar55._0_4_;
        auVar56._4_4_ = auVar69._4_4_ * auVar55._4_4_;
        auVar56._8_4_ = auVar69._8_4_ * auVar55._8_4_;
        auVar56._12_4_ = auVar69._12_4_ * auVar55._12_4_;
        auVar56 = vfmsub231ps_fma(auVar56,auVar44,auVar50);
        local_1620._0_4_ = local_1620._4_4_;
        fStack_1618 = local_1620._4_4_;
        fStack_1614 = local_1620._4_4_;
        auVar51._0_4_ = auVar56._0_4_ * local_1620._4_4_;
        auVar51._4_4_ = auVar56._4_4_ * local_1620._4_4_;
        auVar51._8_4_ = auVar56._8_4_ * local_1620._4_4_;
        auVar51._12_4_ = auVar56._12_4_ * local_1620._4_4_;
        auVar43 = vfmadd231ps_fma(auVar51,auVar90,auVar43);
        auVar56 = vfmadd231ps_fma(auVar43,local_1680,auVar76);
        local_1550 = local_1570._0_4_;
        fStack_154c = local_1570._4_4_;
        fStack_1548 = local_1570._8_4_;
        fStack_1544 = local_1570._12_4_;
        local_1530._0_4_ = auVar56._0_4_ + local_1550 + local_1540._0_4_;
        local_1530._4_4_ = auVar56._4_4_ + fStack_154c + local_1540._4_4_;
        local_1530._8_4_ = auVar56._8_4_ + fStack_1548 + local_1540._8_4_;
        local_1530._12_4_ = auVar56._12_4_ + fStack_1544 + local_1540._12_4_;
        auVar57._8_4_ = 0x7fffffff;
        auVar57._0_8_ = 0x7fffffff7fffffff;
        auVar57._12_4_ = 0x7fffffff;
        auVar43 = vminps_avx(local_1570,local_1540);
        auVar43 = vminps_avx(auVar43,auVar56);
        local_1580 = vandps_avx(local_1530,auVar57);
        auVar85._0_4_ = local_1580._0_4_ * 1.1920929e-07;
        auVar85._4_4_ = local_1580._4_4_ * 1.1920929e-07;
        auVar85._8_4_ = local_1580._8_4_ * 1.1920929e-07;
        auVar85._12_4_ = local_1580._12_4_ * 1.1920929e-07;
        uVar29 = CONCAT44(auVar85._4_4_,auVar85._0_4_);
        auVar77._0_8_ = uVar29 ^ 0x8000000080000000;
        auVar77._8_4_ = -auVar85._8_4_;
        auVar77._12_4_ = -auVar85._12_4_;
        auVar43 = vcmpps_avx(auVar43,auVar77,5);
        auVar76 = vmaxps_avx(local_1570,local_1540);
        auVar76 = vmaxps_avx(auVar76,auVar56);
        auVar76 = vcmpps_avx(auVar76,auVar85,2);
        auVar43 = vorps_avx(auVar43,auVar76);
        if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar43[0xf] < '\0') {
          auVar52._0_4_ = local_1650._0_4_ * fVar10;
          auVar52._4_4_ = local_1650._4_4_ * fVar13;
          auVar52._8_4_ = local_1650._8_4_ * fVar16;
          auVar52._12_4_ = local_1650._12_4_ * fVar19;
          auVar72._0_4_ = fVar9 * local_1660._0_4_;
          auVar72._4_4_ = fVar12 * local_1660._4_4_;
          auVar72._8_4_ = fVar15 * local_1660._8_4_;
          auVar72._12_4_ = fVar18 * local_1660._12_4_;
          auVar51 = vfmsub213ps_fma(local_1660,local_1560,auVar52);
          auVar78._0_4_ = auVar69._0_4_ * fVar8;
          auVar78._4_4_ = auVar69._4_4_ * fVar11;
          auVar78._8_4_ = auVar69._8_4_ * fVar14;
          auVar78._12_4_ = auVar69._12_4_ * fVar17;
          auVar86._0_4_ = fVar9 * auVar70._0_4_;
          auVar86._4_4_ = fVar12 * auVar70._4_4_;
          auVar86._8_4_ = fVar15 * auVar70._8_4_;
          auVar86._12_4_ = fVar18 * auVar70._12_4_;
          auVar70 = vfmsub213ps_fma(auVar70,auVar65,auVar78);
          auVar76 = vandps_avx(auVar52,auVar57);
          auVar56 = vandps_avx(auVar78,auVar57);
          auVar76 = vcmpps_avx(auVar76,auVar56,1);
          local_14d0 = vblendvps_avx(auVar70,auVar51,auVar76);
          auVar79._0_4_ = auVar44._0_4_ * fVar10;
          auVar79._4_4_ = auVar44._4_4_ * fVar13;
          auVar79._8_4_ = auVar44._8_4_ * fVar16;
          auVar79._12_4_ = auVar44._12_4_ * fVar19;
          auVar70 = vfmsub213ps_fma(auVar44,local_1560,auVar86);
          auVar53._0_4_ = local_1640._0_4_ * fVar8;
          auVar53._4_4_ = local_1640._4_4_ * fVar11;
          auVar53._8_4_ = local_1640._8_4_ * fVar14;
          auVar53._12_4_ = local_1640._12_4_ * fVar17;
          auVar51 = vfmsub213ps_fma(local_1650,auVar75,auVar53);
          auVar76 = vandps_avx(auVar53,auVar57);
          auVar56 = vandps_avx(auVar86,auVar57);
          auVar76 = vcmpps_avx(auVar76,auVar56,1);
          local_14c0 = vblendvps_avx(auVar70,auVar51,auVar76);
          auVar70 = vfmsub213ps_fma(local_1640,auVar65,auVar72);
          auVar69 = vfmsub213ps_fma(auVar69,auVar75,auVar79);
          auVar76 = vandps_avx(auVar72,auVar57);
          auVar56 = vandps_avx(auVar79,auVar57);
          auVar76 = vcmpps_avx(auVar76,auVar56,1);
          local_14b0 = vblendvps_avx(auVar69,auVar70,auVar76);
          auVar69._0_4_ = local_14b0._0_4_ * local_1620._4_4_;
          auVar69._4_4_ = local_14b0._4_4_ * local_1620._4_4_;
          auVar69._8_4_ = local_14b0._8_4_ * local_1620._4_4_;
          auVar69._12_4_ = local_14b0._12_4_ * local_1620._4_4_;
          auVar76 = vfmadd213ps_fma(auVar90,local_14c0,auVar69);
          auVar76 = vfmadd213ps_fma(local_1680,local_14d0,auVar76);
          auVar73._0_4_ = auVar76._0_4_ + auVar76._0_4_;
          auVar73._4_4_ = auVar76._4_4_ + auVar76._4_4_;
          auVar73._8_4_ = auVar76._8_4_ + auVar76._8_4_;
          auVar73._12_4_ = auVar76._12_4_ + auVar76._12_4_;
          auVar70._0_4_ = local_14b0._0_4_ * fVar4;
          auVar70._4_4_ = local_14b0._4_4_ * fVar5;
          auVar70._8_4_ = local_14b0._8_4_ * fVar6;
          auVar70._12_4_ = local_14b0._12_4_ * fVar7;
          auVar76 = vfmadd213ps_fma(local_1610,local_14c0,auVar70);
          auVar56 = vfmadd213ps_fma(local_1600,local_14d0,auVar76);
          auVar76 = vrcpps_avx(auVar73);
          auVar88._8_4_ = 0x3f800000;
          auVar88._0_8_ = 0x3f8000003f800000;
          auVar88._12_4_ = 0x3f800000;
          auVar69 = vfnmadd213ps_fma(auVar76,auVar73,auVar88);
          auVar76 = vfmadd132ps_fma(auVar69,auVar76,auVar76);
          local_14e0._0_4_ = auVar76._0_4_ * (auVar56._0_4_ + auVar56._0_4_);
          local_14e0._4_4_ = auVar76._4_4_ * (auVar56._4_4_ + auVar56._4_4_);
          local_14e0._8_4_ = auVar76._8_4_ * (auVar56._8_4_ + auVar56._8_4_);
          local_14e0._12_4_ = auVar76._12_4_ * (auVar56._12_4_ + auVar56._12_4_);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar80._4_4_ = uVar1;
          auVar80._0_4_ = uVar1;
          auVar80._8_4_ = uVar1;
          auVar80._12_4_ = uVar1;
          auVar76 = vcmpps_avx(auVar80,local_14e0,2);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar89._4_4_ = uVar1;
          auVar89._0_4_ = uVar1;
          auVar89._8_4_ = uVar1;
          auVar89._12_4_ = uVar1;
          auVar74 = ZEXT1664(auVar89);
          auVar56 = vcmpps_avx(local_14e0,auVar89,2);
          auVar76 = vandps_avx(auVar56,auVar76);
          auVar56 = auVar43 & auVar76;
          if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar56 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar56 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar56[0xf] < '\0') {
            auVar43 = vandps_avx(auVar43,auVar76);
            auVar76 = vcmpps_avx(auVar73,_DAT_01f7aa10,4);
            local_1510 = vandps_avx(auVar43,auVar76);
            uVar34 = vmovmskps_avx(local_1510);
            if (uVar34 != 0) {
              lVar30 = lVar30 + uVar39;
              uStack_1688 = auVar90._8_8_;
              local_1690 = lVar30;
              local_1520 = &local_1691;
              auVar43 = vrcpps_avx(local_1530);
              auVar58._8_4_ = 0x3f800000;
              auVar58._0_8_ = 0x3f8000003f800000;
              auVar58._12_4_ = 0x3f800000;
              auVar76 = vfnmadd213ps_fma(local_1530,auVar43,auVar58);
              auVar76 = vfmadd132ps_fma(auVar76,auVar43,auVar43);
              auVar54._8_4_ = 0x219392ef;
              auVar54._0_8_ = 0x219392ef219392ef;
              auVar54._12_4_ = 0x219392ef;
              auVar43 = vcmpps_avx(local_1580,auVar54,5);
              auVar43 = vandps_avx(auVar43,auVar76);
              auVar46._0_4_ = local_1550 * auVar43._0_4_;
              auVar46._4_4_ = fStack_154c * auVar43._4_4_;
              auVar46._8_4_ = fStack_1548 * auVar43._8_4_;
              auVar46._12_4_ = fStack_1544 * auVar43._12_4_;
              local_1500 = vminps_avx(auVar46,auVar58);
              auVar47._0_4_ = auVar43._0_4_ * local_1540._0_4_;
              auVar47._4_4_ = auVar43._4_4_ * local_1540._4_4_;
              auVar47._8_4_ = auVar43._8_4_ * local_1540._8_4_;
              auVar47._12_4_ = auVar43._12_4_ * local_1540._12_4_;
              local_14f0 = vminps_avx(auVar47,auVar58);
              uVar29 = (ulong)(uVar34 & 0xff);
              local_1620 = context->scene;
              pSVar35 = context->scene;
              do {
                uVar32 = 0;
                for (uVar23 = uVar29; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000)
                {
                  uVar32 = uVar32 + 1;
                }
                uVar34 = *(uint *)(lVar30 + 0x120 + uVar32 * 4);
                pGVar33 = (pSVar35->geometries).items[uVar34].ptr;
                if ((pGVar33->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  uVar29 = uVar29 ^ 1L << (uVar32 & 0x3f);
                  lVar30 = local_1690;
                }
                else {
                  local_1680._0_8_ = uVar32;
                  local_1600._0_8_ = uVar29;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar33->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0062d425:
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    return bVar42;
                  }
                  local_1610._0_8_ = pGVar33;
                  uVar29 = (ulong)(uint)((int)uVar32 * 4);
                  local_12c0 = *(undefined4 *)(local_1500 + uVar29);
                  local_12a0 = *(undefined4 *)(local_14f0 + uVar29);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_14e0 + uVar29);
                  local_15d0.context = context->user;
                  uVar1 = *(undefined4 *)(local_1690 + 0x130 + uVar29);
                  local_1280._4_4_ = uVar1;
                  local_1280._0_4_ = uVar1;
                  local_1280._8_4_ = uVar1;
                  local_1280._12_4_ = uVar1;
                  local_1280._16_4_ = uVar1;
                  local_1280._20_4_ = uVar1;
                  local_1280._24_4_ = uVar1;
                  local_1280._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_14d0 + uVar29);
                  uVar2 = *(undefined4 *)(local_14c0 + uVar29);
                  local_1300._4_4_ = uVar2;
                  local_1300._0_4_ = uVar2;
                  local_1300._8_4_ = uVar2;
                  local_1300._12_4_ = uVar2;
                  local_1300._16_4_ = uVar2;
                  local_1300._20_4_ = uVar2;
                  local_1300._24_4_ = uVar2;
                  local_1300._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_14b0 + uVar29);
                  local_12e0._4_4_ = uVar2;
                  local_12e0._0_4_ = uVar2;
                  local_12e0._8_4_ = uVar2;
                  local_12e0._12_4_ = uVar2;
                  local_12e0._16_4_ = uVar2;
                  local_12e0._20_4_ = uVar2;
                  local_12e0._24_4_ = uVar2;
                  local_12e0._28_4_ = uVar2;
                  local_1260._4_4_ = uVar34;
                  local_1260._0_4_ = uVar34;
                  local_1260._8_4_ = uVar34;
                  local_1260._12_4_ = uVar34;
                  local_1260._16_4_ = uVar34;
                  local_1260._20_4_ = uVar34;
                  local_1260._24_4_ = uVar34;
                  local_1260._28_4_ = uVar34;
                  local_1320[0] = (RTCHitN)(char)uVar1;
                  local_1320[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[4] = (RTCHitN)(char)uVar1;
                  local_1320[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[8] = (RTCHitN)(char)uVar1;
                  local_1320[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0xc] = (RTCHitN)(char)uVar1;
                  local_1320[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x10] = (RTCHitN)(char)uVar1;
                  local_1320[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x14] = (RTCHitN)(char)uVar1;
                  local_1320[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x18] = (RTCHitN)(char)uVar1;
                  local_1320[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x1c] = (RTCHitN)(char)uVar1;
                  local_1320[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  uStack_12bc = local_12c0;
                  uStack_12b8 = local_12c0;
                  uStack_12b4 = local_12c0;
                  uStack_12b0 = local_12c0;
                  uStack_12ac = local_12c0;
                  uStack_12a8 = local_12c0;
                  uStack_12a4 = local_12c0;
                  uStack_129c = local_12a0;
                  uStack_1298 = local_12a0;
                  uStack_1294 = local_12a0;
                  uStack_1290 = local_12a0;
                  uStack_128c = local_12a0;
                  uStack_1288 = local_12a0;
                  uStack_1284 = local_12a0;
                  auVar48 = vpcmpeqd_avx2(local_1260,local_1260);
                  uStack_123c = (local_15d0.context)->instID[0];
                  local_1240 = uStack_123c;
                  uStack_1238 = uStack_123c;
                  uStack_1234 = uStack_123c;
                  uStack_1230 = uStack_123c;
                  uStack_122c = uStack_123c;
                  uStack_1228 = uStack_123c;
                  uStack_1224 = uStack_123c;
                  uStack_121c = (local_15d0.context)->instPrimID[0];
                  local_1220 = uStack_121c;
                  uStack_1218 = uStack_121c;
                  uStack_1214 = uStack_121c;
                  uStack_1210 = uStack_121c;
                  uStack_120c = uStack_121c;
                  uStack_1208 = uStack_121c;
                  uStack_1204 = uStack_121c;
                  local_15a0 = local_1340;
                  local_15d0.valid = (int *)local_15a0;
                  local_15d0.geometryUserPtr = pGVar33->userPtr;
                  local_15d0.hit = local_1320;
                  local_15d0.N = 8;
                  local_15d0.ray = (RTCRayN *)ray;
                  if (pGVar33->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_1640._0_8_ = k;
                    local_1630._0_8_ = ray;
                    local_1650._0_8_ = puVar36;
                    local_1660._0_8_ = uVar37;
                    local_1670 = auVar74._0_16_;
                    auVar48 = ZEXT1632(auVar48._0_16_);
                    (*pGVar33->occlusionFilterN)(&local_15d0);
                    auVar74 = ZEXT1664(local_1670);
                    auVar48 = vpcmpeqd_avx2(auVar48,auVar48);
                    k = local_1640._0_8_;
                    pGVar33 = (Geometry *)local_1610._0_8_;
                    ray = (RayK<8> *)local_1630._0_8_;
                    puVar36 = (ulong *)local_1650._0_8_;
                    uVar37 = local_1660._0_8_;
                  }
                  auVar20 = vpcmpeqd_avx2(local_15a0,_DAT_01faff00);
                  auVar22 = auVar48 & ~auVar20;
                  if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar22 >> 0x7f,0) == '\0') &&
                        (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar22 >> 0xbf,0) == '\0') &&
                      (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar22[0x1f]) {
                    auVar20 = auVar20 ^ auVar48;
                  }
                  else {
                    p_Var3 = context->args->filter;
                    if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar33->field_8).field_0x2 & 0x40) != 0)))) {
                      local_1640._0_8_ = k;
                      local_1630._0_8_ = ray;
                      local_1650._0_8_ = puVar36;
                      local_1660._0_8_ = uVar37;
                      local_1670 = auVar74._0_16_;
                      auVar48 = ZEXT1632(auVar48._0_16_);
                      (*p_Var3)(&local_15d0);
                      auVar74 = ZEXT1664(local_1670);
                      auVar48 = vpcmpeqd_avx2(auVar48,auVar48);
                      k = local_1640._0_8_;
                      ray = (RayK<8> *)local_1630._0_8_;
                      puVar36 = (ulong *)local_1650._0_8_;
                      uVar37 = local_1660._0_8_;
                    }
                    auVar22 = vpcmpeqd_avx2(local_15a0,_DAT_01faff00);
                    auVar20 = auVar22 ^ auVar48;
                    auVar59._8_4_ = 0xff800000;
                    auVar59._0_8_ = 0xff800000ff800000;
                    auVar59._12_4_ = 0xff800000;
                    auVar59._16_4_ = 0xff800000;
                    auVar59._20_4_ = 0xff800000;
                    auVar59._24_4_ = 0xff800000;
                    auVar59._28_4_ = 0xff800000;
                    auVar48 = vblendvps_avx(auVar59,*(undefined1 (*) [32])(local_15d0.ray + 0x100),
                                            auVar22);
                    *(undefined1 (*) [32])(local_15d0.ray + 0x100) = auVar48;
                  }
                  if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar20 >> 0x7f,0) != '\0') ||
                        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar20 >> 0xbf,0) != '\0') ||
                      (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar20[0x1f] < '\0') goto LAB_0062d425;
                  *(int *)(ray + k * 4 + 0x100) = auVar74._0_4_;
                  uVar29 = local_1600._0_8_ ^ 1L << (local_1680._0_8_ & 0x3f);
                  lVar30 = local_1690;
                }
                pSVar35 = local_1620;
              } while (uVar29 != 0);
            }
          }
        }
        local_15e8 = local_15e8 + 1;
        auVar74 = ZEXT3264(local_1360);
        auVar81 = ZEXT3264(local_1380);
        auVar82 = ZEXT3264(local_13a0);
        auVar94 = ZEXT3264(local_1480);
        auVar95 = ZEXT3264(local_14a0);
      } while (local_15e8 != local_15e0);
    }
LAB_0062d40f:
    bVar42 = puVar36 != &local_1200;
    if (!bVar42) {
      return bVar42;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }